

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O1

int BeliefValue::GetMaximizingVectorIndexAndValue
              (BeliefInterface *b,VectorSet *v,vector<bool,_std::allocator<bool>_> *mask,
              double *value)

{
  double dVar1;
  _Bit_type *p_Var2;
  E *this;
  undefined8 *puVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  vector<double,_std::allocator<double>_> Vb;
  void *local_40 [2];
  long local_30;
  
  p_Var2 = (mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  iVar4 = (int)v->size1_;
  if ((*(int *)&(mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_p - (int)p_Var2) * 8 +
      (mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset != iVar4) {
    this = (E *)__cxa_allocate_exception(0x28);
    E::E(this,"BeliefValue::GetMaximizingVectorIndex: mask has incorrect size");
    __cxa_throw(this,&E::typeinfo,E::~E);
  }
  if (iVar4 != 0) {
    uVar7 = v->size1_ & 0xffffffff;
    uVar5 = 0;
    do {
      if ((p_Var2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) {
        (*b->_vptr_BeliefInterface[0x12])(local_40);
        *value = -1.79769313486232e+308;
        p_Var2 = (mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                 ._M_start.super__Bit_iterator_base._M_p;
        auVar8 = ZEXT1664(ZEXT816(0xffefffffffffffff));
        uVar6 = 0x7fffffff;
        uVar5 = 0;
        do {
          if (((p_Var2[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) &&
             (dVar1 = *(double *)((long)local_40[0] + uVar5 * 8), auVar8._0_8_ < dVar1)) {
            *value = dVar1;
            auVar8 = ZEXT864((ulong)dVar1);
            uVar6 = uVar5 & 0xffffffff;
          }
          uVar5 = uVar5 + 1;
        } while (uVar7 != uVar5);
        if ((*value == -1.79769313486232e+308) && (!NAN(*value))) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
          *puVar3 = &PTR__E_0059bd80;
          puVar3[1] = puVar3 + 3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)(puVar3 + 1),
                     "BeliefValue::GetMaximizingVectorIndex: no maximizing vector found","");
          __cxa_throw(puVar3,&E::typeinfo,E::~E);
        }
        if (local_40[0] == (void *)0x0) {
          return (int)uVar6;
        }
        operator_delete(local_40[0],local_30 - (long)local_40[0]);
        return (int)uVar6;
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  return -1;
}

Assistant:

int 
BeliefValue::GetMaximizingVectorIndexAndValue(const BeliefInterface &b, 
                                              const VectorSet &v,
                                              const vector<bool> &mask,
                                              double &value)
{
    //ugly, copy of JointBelief version..

    int nrInV=v.size1();
    int maximizingVectorI=INT_MAX;
    bool maskValid=false;

    if(static_cast<int>(mask.size())!=nrInV)
    {
        throw(E("BeliefValue::GetMaximizingVectorIndex: mask has incorrect size"));
    }

    for(int k=0;k!=nrInV;k++)
        if(mask[k])
        {
            maskValid=true;
            break;
        }

    // no vector was enabled in the mask, so there is no maximizing vector
    if(!maskValid)
        return(-1);

    // compute value of b for every vector in VS which has its mask
    // set to true
    vector<double> Vb=b.InnerProduct(v,mask);

    // find maximizing vector, ignores effects of duplicate values
    value=-DBL_MAX;
    for(int k=0;k!=nrInV;k++)
    {
        if(mask[k] && Vb[k]>value)
        {
            value=Vb[k];
            maximizingVectorI=k;
        }
    }

    if(value==-DBL_MAX)
    {
         throw(E("BeliefValue::GetMaximizingVectorIndex: no maximizing vector found"));
    }
    return(maximizingVectorI);
}